

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_functions.cc
# Opt level: O1

float __thiscall
poisson_loss::getRevertingWeight
          (poisson_loss *this,shared_data *param_1,float param_2,float param_3)

{
  vw_exception *this_00;
  stringstream __msg;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (&local_190,"Active learning not supported by poisson loss",0x2d);
  this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/loss_functions.cc"
             ,0x156,&local_1c0);
  __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

float getRevertingWeight(shared_data* /* sd */, float /* prediction */, float /* eta_t */)
  {
    THROW("Active learning not supported by poisson loss");
  }